

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# A_socket.h
# Opt level: O2

void __thiscall adapter::ASocket::ASocket(ASocket *this)

{
  __shared_ptr<adapter::APlug,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  this->_vptr_ASocket = (_func_int **)&PTR_charge_001367b8;
  (this->paplug_).super___shared_ptr<adapter::APlug,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->paplug_).super___shared_ptr<adapter::APlug,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::make_shared<adapter::APlug>();
  std::__shared_ptr<adapter::APlug,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->paplug_).super___shared_ptr<adapter::APlug,_(__gnu_cxx::_Lock_policy)2>,
             &local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return;
}

Assistant:

ASocket::ASocket(/* args */) {
    paplug_ = std::make_shared<APlug>();
}